

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImageLoader::skip_data(CVmImageLoader *this,size_t skip_len,ulong *remaining_size)

{
  if (skip_len <= *remaining_size) {
    *remaining_size = *remaining_size - skip_len;
    (*this->fp_->_vptr_CVmImageFile[9])();
    return;
  }
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::skip_data(size_t skip_len, ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (skip_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we're skipping */
    *remaining_size -= skip_len;

    /* skip ahead in the underlying file */
    fp_->skip_ahead(skip_len);
}